

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O2

void __thiscall
fasttext::ProductQuantizer::ProductQuantizer(ProductQuantizer *this,int32_t dim,int32_t dsub)

{
  unsigned_long __res;
  int iVar1;
  ulong uVar2;
  allocator_type local_11;
  
  this->nbits_ = 8;
  this->ksub_ = 0x100;
  this->max_points_per_cluster_ = 0x100;
  this->max_points_ = 0x10000;
  this->seed_ = 0x4d2;
  this->niter_ = 0x19;
  this->eps_ = 1e-07;
  this->dim_ = dim;
  this->nsubq_ = dim / dsub;
  this->dsub_ = dsub;
  std::vector<float,_std::allocator<float>_>::vector(&this->centroids_,(long)(dim << 8),&local_11);
  uVar2 = (ulong)(long)this->seed_ % 0x7fffffff;
  (this->rng)._M_x = uVar2 + (uVar2 == 0);
  iVar1 = this->dim_ % dsub;
  this->lastdsub_ = iVar1;
  if (iVar1 == 0) {
    this->lastdsub_ = this->dsub_;
  }
  else {
    this->nsubq_ = this->nsubq_ + 1;
  }
  return;
}

Assistant:

ProductQuantizer::ProductQuantizer(int32_t dim, int32_t dsub)
    : dim_(dim),
      nsubq_(dim / dsub),
      dsub_(dsub),
      centroids_(dim * ksub_),
      rng(seed_) {
  lastdsub_ = dim_ % dsub;
  if (lastdsub_ == 0) {
    lastdsub_ = dsub_;
  } else {
    nsubq_++;
  }
}